

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall ValueTest::checkIsLess(ValueTest *this,Value *x,Value *y)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = Json::Value::operator<(x,y);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              ((this->super_TestCase).result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x5b1,"x < y");
  }
  bVar1 = Json::Value::operator>(y,x);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              ((this->super_TestCase).result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x5b2,"y > x");
  }
  bVar1 = Json::Value::operator<=(x,y);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              ((this->super_TestCase).result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x5b3,"x <= y");
  }
  bVar1 = Json::Value::operator>=(y,x);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              ((this->super_TestCase).result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x5b4,"y >= x");
  }
  bVar1 = Json::Value::operator==(x,y);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((this->super_TestCase).result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x5b5,"!(x == y)");
  }
  bVar1 = Json::Value::operator==(y,x);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((this->super_TestCase).result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x5b6,"!(y == x)");
  }
  bVar1 = Json::Value::operator>=(x,y);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((this->super_TestCase).result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x5b7,"!(x >= y)");
  }
  bVar1 = Json::Value::operator<=(y,x);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((this->super_TestCase).result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x5b8,"!(y <= x)");
  }
  bVar1 = Json::Value::operator>(x,y);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((this->super_TestCase).result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x5b9,"!(x > y)");
  }
  bVar1 = Json::Value::operator<(y,x);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((this->super_TestCase).result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x5ba,"!(y < x)");
  }
  iVar2 = Json::Value::compare(x,y);
  if (-1 < iVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_TestCase).result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x5bb,"x.compare(y) < 0");
  }
  iVar2 = Json::Value::compare(y,x);
  if (-1 < iVar2) {
    return;
  }
  JsonTest::TestResult::addFailure
            ((this->super_TestCase).result_,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x5bc,"y.compare(x) >= 0");
  return;
}

Assistant:

void ValueTest::checkIsLess(const Json::Value& x, const Json::Value& y) {
  JSONTEST_ASSERT(x < y);
  JSONTEST_ASSERT(y > x);
  JSONTEST_ASSERT(x <= y);
  JSONTEST_ASSERT(y >= x);
  JSONTEST_ASSERT(!(x == y));
  JSONTEST_ASSERT(!(y == x));
  JSONTEST_ASSERT(!(x >= y));
  JSONTEST_ASSERT(!(y <= x));
  JSONTEST_ASSERT(!(x > y));
  JSONTEST_ASSERT(!(y < x));
  JSONTEST_ASSERT(x.compare(y) < 0);
  JSONTEST_ASSERT(y.compare(x) >= 0);
}